

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp
          (NewEdgeCalculator *this,int *tc,bool pe1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe2,double *prob0,AlignmentRecord *ap1,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          uint *pos1)

{
  int iVar1;
  uint uVar2;
  mapValue *val1;
  mapValue *pmVar3;
  const_reference pvVar4;
  byte in_DL;
  int *in_RSI;
  NewEdgeCalculator *in_RDI;
  byte in_R8B;
  AlignmentRecord *in_stack_00000008;
  AlignmentRecord *in_stack_00000010;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_stack_00000018;
  value_type *v1;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  
  do {
    while( true ) {
      val1 = (mapValue *)(ulong)(uint)v1->ref;
      pmVar3 = (mapValue *)
               std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               size(in_stack_00000018);
      if (pmVar3 <= val1) {
        return;
      }
      pvVar4 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               operator[](in_stack_00000018,(ulong)(uint)v1->ref);
      if (((in_DL & 1) != 0) && ((in_R8B & 1) != 0)) break;
      iVar1 = pvVar4->read;
      pvVar4 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
               back((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *
                    )CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (iVar1 != pvVar4->read) {
        return;
      }
      calculateProb0(in_RDI,val1,
                     (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      v1->ref = v1->ref + 1;
      *in_RSI = *in_RSI + 1;
    }
    in_stack_ffffffffffffffb4 = AlignmentRecord::getStart2(in_stack_00000008);
    uVar2 = AlignmentRecord::getEnd2(in_stack_00000010);
    if (uVar2 < in_stack_ffffffffffffffb4) {
      in_stack_ffffffffffffffb0 = pvVar4->ref;
      uVar2 = AlignmentRecord::getStart2(in_stack_00000008);
      if (uVar2 <= in_stack_ffffffffffffffb0) {
        return;
      }
    }
    calculateProb0(in_RDI,val1,
                   (double *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    v1->ref = v1->ref + 1;
    *in_RSI = *in_RSI + 1;
  } while( true );
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp(int& tc, bool pe1, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe2, double& prob0, const AlignmentRecord& ap1, const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap1, unsigned int& pos1) const
{
    while(pos1 < cov_ap1.size()){
        auto& v1 = cov_ap1[pos1];
        if(pe1 && pe2){
            if(ap1.getStart2() > ap2.getEnd2() && v1.ref >= ap1.getStart2()) break;
            else {
                calculateProb0(v1,prob0);
                pos1++;
                tc++;
            }
        }
        else if (v1.read == cov_ap2.back().read){
            calculateProb0(v1,prob0);
            pos1++;
            tc++;
        } else break;
    }
}